

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

int redisSetBlocking(redisContext *c,int blocking)

{
  int iVar1;
  uint local_20;
  int flags;
  int blocking_local;
  redisContext *c_local;
  
  local_20 = fcntl(c->fd,3);
  if (local_20 == 0xffffffff) {
    __redisSetErrorFromErrno(c,1,"fcntl(F_GETFL)");
    redisNetClose(c);
    c_local._4_4_ = -1;
  }
  else {
    if (blocking == 0) {
      local_20 = local_20 | 0x800;
    }
    else {
      local_20 = local_20 & 0xfffff7ff;
    }
    iVar1 = fcntl(c->fd,4,(ulong)local_20);
    if (iVar1 == -1) {
      __redisSetErrorFromErrno(c,1,"fcntl(F_SETFL)");
      redisNetClose(c);
      c_local._4_4_ = -1;
    }
    else {
      c_local._4_4_ = 0;
    }
  }
  return c_local._4_4_;
}

Assistant:

static int redisSetBlocking(redisContext *c, int blocking) {
#ifndef _WIN32
    int flags;

    /* Set the socket nonblocking.
     * Note that fcntl(2) for F_GETFL and F_SETFL can't be
     * interrupted by a signal. */
    if ((flags = fcntl(c->fd, F_GETFL)) == -1) {
        __redisSetErrorFromErrno(c,REDIS_ERR_IO,"fcntl(F_GETFL)");
        redisNetClose(c);
        return REDIS_ERR;
    }

    if (blocking)
        flags &= ~O_NONBLOCK;
    else
        flags |= O_NONBLOCK;

    if (fcntl(c->fd, F_SETFL, flags) == -1) {
        __redisSetErrorFromErrno(c,REDIS_ERR_IO,"fcntl(F_SETFL)");
        redisNetClose(c);
        return REDIS_ERR;
    }
#else
    u_long mode = blocking ? 0 : 1;
    if (ioctl(c->fd, FIONBIO, &mode) == -1) {
        __redisSetErrorFromErrno(c, REDIS_ERR_IO, "ioctl(FIONBIO)");
        redisNetClose(c);
        return REDIS_ERR;
    }
#endif /* _WIN32 */
    return REDIS_OK;
}